

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_ssse3.c
# Opt level: O1

void av1_highbd_convolve_x_sr_ssse3
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  uint16_t uVar1;
  undefined1 (*pauVar5) [32];
  int16_t *piVar6;
  undefined8 uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint16_t *puVar27;
  ulong uVar28;
  uint uVar29;
  undefined1 (*pauVar30) [16];
  undefined1 auVar31 [16];
  int iVar32;
  int iVar33;
  short sVar34;
  undefined4 uVar35;
  short sVar40;
  short sVar41;
  undefined4 uVar42;
  short sVar43;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  short sVar51;
  short sVar53;
  short sVar54;
  short sVar55;
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ushort uVar58;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ushort uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  short local_a8;
  short sStack_a6;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  
  uVar58 = filter_params_x->taps;
  uVar25 = 7 - conv_params->round_0;
  uVar26 = 0xff;
  if (bd == 0xc) {
    uVar26 = 0xfff;
  }
  uVar29 = 0x3ff;
  if (bd != 10) {
    uVar29 = uVar26;
  }
  pauVar23 = (undefined1 (*) [16])(src + (1 - (ulong)(uVar58 >> 1)));
  auVar31 = ZEXT416((uint)conv_params->round_0);
  auVar47 = ZEXT416(uVar25);
  iVar32 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
  iVar33 = (1 << ((byte)uVar25 & 0x1f)) >> 1;
  auVar36 = pshuflw(ZEXT416(uVar29),ZEXT416(uVar29),0);
  local_a8 = auVar36._0_2_;
  sStack_a6 = auVar36._2_2_;
  if (uVar58 == 0xc) {
    if (0 < w) {
      uVar24 = (ulong)((subpel_x_qn & 0xfU) * (uint)uVar58);
      uVar7 = *(undefined8 *)(filter_params_x->filter_ptr + uVar24 + 8);
      piVar6 = filter_params_x->filter_ptr + uVar24;
      uVar18 = *(undefined4 *)piVar6;
      uVar19 = *(undefined4 *)(piVar6 + 2);
      uVar20 = *(undefined4 *)(piVar6 + 4);
      uVar21 = *(undefined4 *)(piVar6 + 6);
      uVar35 = (undefined4)uVar7;
      uVar42 = (undefined4)((ulong)uVar7 >> 0x20);
      pauVar23 = pauVar23 + 2;
      uVar24 = 0;
      auVar39._4_4_ = uVar35;
      auVar39._0_4_ = uVar35;
      auVar39._8_4_ = uVar35;
      auVar39._12_4_ = uVar35;
      auVar50._4_4_ = uVar18;
      auVar50._0_4_ = uVar18;
      auVar50._8_4_ = uVar18;
      auVar50._12_4_ = uVar18;
      auVar38._4_4_ = uVar19;
      auVar38._0_4_ = uVar19;
      auVar38._8_4_ = uVar19;
      auVar38._12_4_ = uVar19;
      do {
        puVar27 = dst;
        uVar28 = (ulong)(uint)h;
        pauVar30 = pauVar23;
        if (0 < h) {
          do {
            pauVar5 = (undefined1 (*) [32])(pauVar30 + -2);
            auVar36 = pauVar30[-1];
            auVar46 = *pauVar30;
            auVar8._16_16_ = auVar46;
            auVar8._0_16_ = auVar36;
            auVar22._4_4_ = uVar20;
            auVar22._0_4_ = uVar20;
            auVar22._8_4_ = uVar20;
            auVar22._12_4_ = uVar20;
            auVar44 = pmaddwd(SUB3216(*pauVar5,8),auVar22);
            auVar52._4_4_ = uVar21;
            auVar52._0_4_ = uVar21;
            auVar52._8_4_ = uVar21;
            auVar52._12_4_ = uVar21;
            auVar37 = pmaddwd(SUB3216(*pauVar5,0xc),auVar52);
            auVar45 = pmaddwd(auVar36,auVar39);
            auVar49._4_4_ = uVar42;
            auVar49._0_4_ = uVar42;
            auVar49._8_4_ = uVar42;
            auVar49._12_4_ = uVar42;
            auVar56 = pmaddwd(auVar8._4_16_,auVar49);
            auVar9._16_16_ = auVar46;
            auVar9._0_16_ = auVar36;
            auVar10._16_16_ = auVar46;
            auVar10._0_16_ = auVar36;
            auVar59 = pmaddwd(*(undefined1 (*) [16])*pauVar5,auVar50);
            auVar68 = pmaddwd(SUB3216(*pauVar5,4),auVar38);
            auVar48 = pmaddwd(SUB3216(*pauVar5,6),auVar38);
            auVar36 = pmaddwd(SUB3216(*pauVar5,10),auVar22);
            auVar69._4_4_ = uVar21;
            auVar69._0_4_ = uVar21;
            auVar69._8_4_ = uVar21;
            auVar69._12_4_ = uVar21;
            auVar49 = pmaddwd(SUB3216(*pauVar5,0xe),auVar69);
            auVar52 = pmaddwd(auVar9._2_16_,auVar39);
            auVar57._4_4_ = uVar42;
            auVar57._0_4_ = uVar42;
            auVar57._8_4_ = uVar42;
            auVar57._12_4_ = uVar42;
            auVar46 = pmaddwd(auVar10._6_16_,auVar57);
            auVar57 = pmaddwd(SUB3216(*pauVar5,2),auVar50);
            auVar60._0_4_ =
                 (auVar59._0_4_ + iVar32 + auVar68._0_4_ + auVar37._0_4_ + auVar44._0_4_ +
                  auVar56._0_4_ + auVar45._0_4_ >> auVar31) + iVar33 >> auVar47;
            auVar60._4_4_ =
                 (auVar59._4_4_ + iVar32 + auVar68._4_4_ + auVar37._4_4_ + auVar44._4_4_ +
                  auVar56._4_4_ + auVar45._4_4_ >> auVar31) + iVar33 >> auVar47;
            auVar60._8_4_ =
                 (auVar59._8_4_ + iVar32 + auVar68._8_4_ + auVar37._8_4_ + auVar44._8_4_ +
                  auVar56._8_4_ + auVar45._8_4_ >> auVar31) + iVar33 >> auVar47;
            auVar60._12_4_ =
                 (auVar59._12_4_ + iVar32 + auVar68._12_4_ + auVar37._12_4_ + auVar44._12_4_ +
                  auVar56._12_4_ + auVar45._12_4_ >> auVar31) + iVar33 >> auVar47;
            auVar37 = packssdw(auVar60,auVar60);
            auVar56._0_4_ =
                 (auVar57._0_4_ + iVar32 + auVar36._0_4_ + auVar48._0_4_ +
                  auVar46._0_4_ + auVar52._0_4_ + auVar49._0_4_ >> auVar31) + iVar33 >> auVar47;
            auVar56._4_4_ =
                 (auVar57._4_4_ + iVar32 + auVar36._4_4_ + auVar48._4_4_ +
                  auVar46._4_4_ + auVar52._4_4_ + auVar49._4_4_ >> auVar31) + iVar33 >> auVar47;
            auVar56._8_4_ =
                 (auVar57._8_4_ + iVar32 + auVar36._8_4_ + auVar48._8_4_ +
                  auVar46._8_4_ + auVar52._8_4_ + auVar49._8_4_ >> auVar31) + iVar33 >> auVar47;
            auVar56._12_4_ =
                 (auVar57._12_4_ + iVar32 + auVar36._12_4_ + auVar48._12_4_ +
                  auVar46._12_4_ + auVar52._12_4_ + auVar49._12_4_ >> auVar31) + iVar33 >> auVar47;
            auVar36 = packssdw(auVar56,auVar56);
            sVar43 = auVar36._6_2_;
            sVar55 = auVar37._6_2_;
            sVar41 = auVar36._4_2_;
            sVar54 = auVar37._4_2_;
            sVar40 = auVar36._2_2_;
            sVar53 = auVar37._2_2_;
            sVar34 = auVar36._0_2_;
            sVar51 = auVar37._0_2_;
            uVar58 = (ushort)(local_a8 < sVar51) * local_a8 | (ushort)(local_a8 >= sVar51) * sVar51;
            uVar61 = (ushort)(sStack_a6 < sVar34) * sStack_a6 |
                     (ushort)(sStack_a6 >= sVar34) * sVar34;
            uVar62 = (ushort)(local_a8 < sVar53) * local_a8 | (ushort)(local_a8 >= sVar53) * sVar53;
            uVar63 = (ushort)(sStack_a6 < sVar40) * sStack_a6 |
                     (ushort)(sStack_a6 >= sVar40) * sVar40;
            uVar64 = (ushort)(local_a8 < sVar54) * local_a8 | (ushort)(local_a8 >= sVar54) * sVar54;
            uVar65 = (ushort)(sStack_a6 < sVar41) * sStack_a6 |
                     (ushort)(sStack_a6 >= sVar41) * sVar41;
            uVar66 = (ushort)(local_a8 < sVar55) * local_a8 | (ushort)(local_a8 >= sVar55) * sVar55;
            uVar67 = (ushort)(sStack_a6 < sVar43) * sStack_a6 |
                     (ushort)(sStack_a6 >= sVar43) * sVar43;
            uVar1 = (-1 < (short)uVar58) * uVar58;
            uVar2 = (-1 < (short)uVar61) * uVar61;
            uVar3 = (-1 < (short)uVar62) * uVar62;
            uVar4 = (-1 < (short)uVar63) * uVar63;
            if ((long)uVar24 < (long)((ulong)(uint)w - 4)) {
              *puVar27 = uVar1;
              puVar27[1] = uVar2;
              puVar27[2] = uVar3;
              puVar27[3] = uVar4;
              puVar27[4] = (-1 < (short)uVar64) * uVar64;
              puVar27[5] = (-1 < (short)uVar65) * uVar65;
              puVar27[6] = (-1 < (short)uVar66) * uVar66;
              puVar27[7] = (-1 < (short)uVar67) * uVar67;
            }
            else if (w == 4) {
              *puVar27 = uVar1;
              puVar27[1] = uVar2;
              puVar27[2] = uVar3;
              puVar27[3] = uVar4;
            }
            else {
              *puVar27 = uVar1;
              puVar27[1] = uVar2;
            }
            uVar28 = uVar28 - 1;
            puVar27 = puVar27 + dst_stride;
            pauVar30 = (undefined1 (*) [16])(*pauVar30 + (long)src_stride * 2);
          } while (uVar28 != 0);
        }
        uVar24 = uVar24 + 8;
        dst = dst + 8;
        pauVar23 = pauVar23 + 1;
      } while (uVar24 < (uint)w);
    }
  }
  else if (0 < w) {
    piVar6 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)uVar58;
    uVar18 = *(undefined4 *)piVar6;
    uVar19 = *(undefined4 *)(piVar6 + 2);
    uVar20 = *(undefined4 *)(piVar6 + 4);
    uVar21 = *(undefined4 *)(piVar6 + 6);
    auVar46._4_4_ = uVar18;
    auVar46._0_4_ = uVar18;
    auVar46._8_4_ = uVar18;
    auVar46._12_4_ = uVar18;
    auVar37._4_4_ = uVar19;
    auVar37._0_4_ = uVar19;
    auVar37._8_4_ = uVar19;
    auVar37._12_4_ = uVar19;
    auVar36._4_4_ = uVar20;
    auVar36._0_4_ = uVar20;
    auVar36._8_4_ = uVar20;
    auVar36._12_4_ = uVar20;
    auVar44._4_4_ = uVar21;
    auVar44._0_4_ = uVar21;
    auVar44._8_4_ = uVar21;
    auVar44._12_4_ = uVar21;
    uVar24 = 0;
    do {
      pauVar23 = pauVar23 + 1;
      puVar27 = dst;
      uVar28 = (ulong)(uint)h;
      pauVar30 = pauVar23;
      if (0 < h) {
        do {
          auVar39 = pauVar30[-1];
          auVar45 = *pauVar30;
          auVar11._16_16_ = auVar45;
          auVar11._0_16_ = auVar39;
          auVar12._16_16_ = auVar45;
          auVar12._0_16_ = auVar39;
          auVar13._16_16_ = auVar45;
          auVar13._0_16_ = auVar39;
          auVar38 = pmaddwd(auVar12._8_16_,auVar36);
          auVar57 = pmaddwd(auVar13._12_16_,auVar44);
          auVar14._16_16_ = auVar45;
          auVar14._0_16_ = auVar39;
          auVar15._16_16_ = auVar45;
          auVar15._0_16_ = auVar39;
          auVar16._16_16_ = auVar45;
          auVar16._0_16_ = auVar39;
          auVar17._16_16_ = auVar45;
          auVar17._0_16_ = auVar39;
          auVar45 = pmaddwd(auVar39,auVar46);
          auVar49 = pmaddwd(auVar11._4_16_,auVar37);
          auVar39 = pmaddwd(auVar14._2_16_,auVar46);
          auVar52 = pmaddwd(auVar15._6_16_,auVar37);
          auVar69 = pmaddwd(auVar16._10_16_,auVar36);
          auVar50 = pmaddwd(auVar17._14_16_,auVar44);
          auVar48._0_4_ =
               (auVar45._0_4_ + iVar32 + auVar49._0_4_ + auVar57._0_4_ + auVar38._0_4_ >> auVar31) +
               iVar33 >> auVar47;
          auVar48._4_4_ =
               (auVar45._4_4_ + iVar32 + auVar49._4_4_ + auVar57._4_4_ + auVar38._4_4_ >> auVar31) +
               iVar33 >> auVar47;
          auVar48._8_4_ =
               (auVar45._8_4_ + iVar32 + auVar49._8_4_ + auVar57._8_4_ + auVar38._8_4_ >> auVar31) +
               iVar33 >> auVar47;
          auVar48._12_4_ =
               (auVar45._12_4_ + iVar32 + auVar49._12_4_ + auVar57._12_4_ + auVar38._12_4_ >>
               auVar31) + iVar33 >> auVar47;
          auVar38 = packssdw(auVar48,auVar48);
          auVar45._0_4_ =
               (auVar39._0_4_ + iVar32 + auVar69._0_4_ + auVar52._0_4_ + auVar50._0_4_ >> auVar31) +
               iVar33 >> auVar47;
          auVar45._4_4_ =
               (auVar39._4_4_ + iVar32 + auVar69._4_4_ + auVar52._4_4_ + auVar50._4_4_ >> auVar31) +
               iVar33 >> auVar47;
          auVar45._8_4_ =
               (auVar39._8_4_ + iVar32 + auVar69._8_4_ + auVar52._8_4_ + auVar50._8_4_ >> auVar31) +
               iVar33 >> auVar47;
          auVar45._12_4_ =
               (auVar39._12_4_ + iVar32 + auVar69._12_4_ + auVar52._12_4_ + auVar50._12_4_ >>
               auVar31) + iVar33 >> auVar47;
          auVar39 = packssdw(auVar45,auVar45);
          sVar43 = auVar39._6_2_;
          sVar55 = auVar38._6_2_;
          sVar41 = auVar39._4_2_;
          sVar54 = auVar38._4_2_;
          sVar40 = auVar39._2_2_;
          sVar53 = auVar38._2_2_;
          sVar34 = auVar39._0_2_;
          sVar51 = auVar38._0_2_;
          uVar58 = (ushort)(local_a8 < sVar51) * local_a8 | (ushort)(local_a8 >= sVar51) * sVar51;
          uVar61 = (ushort)(sStack_a6 < sVar34) * sStack_a6 | (ushort)(sStack_a6 >= sVar34) * sVar34
          ;
          uVar62 = (ushort)(local_a8 < sVar53) * local_a8 | (ushort)(local_a8 >= sVar53) * sVar53;
          uVar63 = (ushort)(sStack_a6 < sVar40) * sStack_a6 | (ushort)(sStack_a6 >= sVar40) * sVar40
          ;
          uVar64 = (ushort)(local_a8 < sVar54) * local_a8 | (ushort)(local_a8 >= sVar54) * sVar54;
          uVar65 = (ushort)(sStack_a6 < sVar41) * sStack_a6 | (ushort)(sStack_a6 >= sVar41) * sVar41
          ;
          uVar66 = (ushort)(local_a8 < sVar55) * local_a8 | (ushort)(local_a8 >= sVar55) * sVar55;
          uVar67 = (ushort)(sStack_a6 < sVar43) * sStack_a6 | (ushort)(sStack_a6 >= sVar43) * sVar43
          ;
          uVar1 = (-1 < (short)uVar58) * uVar58;
          uVar2 = (-1 < (short)uVar61) * uVar61;
          uVar3 = (-1 < (short)uVar62) * uVar62;
          uVar4 = (-1 < (short)uVar63) * uVar63;
          if ((long)uVar24 < (long)((ulong)(uint)w - 4)) {
            *puVar27 = uVar1;
            puVar27[1] = uVar2;
            puVar27[2] = uVar3;
            puVar27[3] = uVar4;
            puVar27[4] = (-1 < (short)uVar64) * uVar64;
            puVar27[5] = (-1 < (short)uVar65) * uVar65;
            puVar27[6] = (-1 < (short)uVar66) * uVar66;
            puVar27[7] = (-1 < (short)uVar67) * uVar67;
          }
          else if (w == 4) {
            *puVar27 = uVar1;
            puVar27[1] = uVar2;
            puVar27[2] = uVar3;
            puVar27[3] = uVar4;
          }
          else {
            *puVar27 = uVar1;
            puVar27[1] = uVar2;
          }
          uVar28 = uVar28 - 1;
          puVar27 = puVar27 + dst_stride;
          pauVar30 = (undefined1 (*) [16])(*pauVar30 + (long)src_stride * 2);
        } while (uVar28 != 0);
      }
      uVar24 = uVar24 + 8;
      dst = dst + 8;
    } while (uVar24 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_convolve_x_sr_ssse3(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_x,
                                    const int subpel_x_qn,
                                    ConvolveParams *conv_params, int bd) {
  int i, j;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  const __m128i round_const_x =
      _mm_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const int bits = FILTER_BITS - conv_params->round_0;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m128i round_const_bits = _mm_set1_epi32((1 << bits) >> 1);
  const __m128i clip_pixel =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i zero = _mm_setzero_si128();

  if (filter_params_x->taps == 12) {
    __m128i s[6], coeffs_x[6];

    prepare_coeffs_12tap(filter_params_x, subpel_x_qn, coeffs_x);

    for (j = 0; j < w; j += 8) {
      /* Horizontal filter */
      {
        for (i = 0; i < h; i += 1) {
          const __m128i row00 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
          const __m128i row01 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 8)]);
          const __m128i row02 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 16)]);

          // even pixels
          s[0] = _mm_alignr_epi8(row01, row00, 0);
          s[1] = _mm_alignr_epi8(row01, row00, 4);
          s[2] = _mm_alignr_epi8(row01, row00, 8);
          s[3] = _mm_alignr_epi8(row01, row00, 12);
          s[4] = _mm_alignr_epi8(row02, row01, 0);
          s[5] = _mm_alignr_epi8(row02, row01, 4);

          __m128i res_even = convolve_12tap(s, coeffs_x);
          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_x),
                                   round_shift_x);
          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_bits),
                                   round_shift_bits);

          // odd pixels
          s[0] = _mm_alignr_epi8(row01, row00, 2);
          s[1] = _mm_alignr_epi8(row01, row00, 6);
          s[2] = _mm_alignr_epi8(row01, row00, 10);
          s[3] = _mm_alignr_epi8(row01, row00, 14);
          s[4] = _mm_alignr_epi8(row02, row01, 2);
          s[5] = _mm_alignr_epi8(row02, row01, 6);

          __m128i res_odd = convolve_12tap(s, coeffs_x);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_x),
                                  round_shift_x);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_bits),
                                  round_shift_bits);

          __m128i res_even1 = _mm_packs_epi32(res_even, res_even);
          __m128i res_odd1 = _mm_packs_epi32(res_odd, res_odd);
          __m128i res = _mm_unpacklo_epi16(res_even1, res_odd1);

          res = _mm_min_epi16(res, clip_pixel);
          res = _mm_max_epi16(res, zero);

          if (w - j > 4) {
            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res);
          } else if (w == 4) {
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res);
          } else {
            *((int *)(&dst[i * dst_stride + j])) = _mm_cvtsi128_si32(res);
          }
        }
      }
    }
  } else {
    __m128i s[4], coeffs_x[4];
    prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

    for (j = 0; j < w; j += 8) {
      /* Horizontal filter */
      {
        for (i = 0; i < h; i += 1) {
          const __m128i row00 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
          const __m128i row01 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 8)]);

          // even pixels
          s[0] = _mm_alignr_epi8(row01, row00, 0);
          s[1] = _mm_alignr_epi8(row01, row00, 4);
          s[2] = _mm_alignr_epi8(row01, row00, 8);
          s[3] = _mm_alignr_epi8(row01, row00, 12);

          __m128i res_even = convolve(s, coeffs_x);
          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_x),
                                   round_shift_x);

          // odd pixels
          s[0] = _mm_alignr_epi8(row01, row00, 2);
          s[1] = _mm_alignr_epi8(row01, row00, 6);
          s[2] = _mm_alignr_epi8(row01, row00, 10);
          s[3] = _mm_alignr_epi8(row01, row00, 14);

          __m128i res_odd = convolve(s, coeffs_x);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_x),
                                  round_shift_x);

          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_bits),
                                   round_shift_bits);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_bits),
                                  round_shift_bits);

          __m128i res_even1 = _mm_packs_epi32(res_even, res_even);
          __m128i res_odd1 = _mm_packs_epi32(res_odd, res_odd);
          __m128i res = _mm_unpacklo_epi16(res_even1, res_odd1);

          res = _mm_min_epi16(res, clip_pixel);
          res = _mm_max_epi16(res, zero);

          if (w - j > 4) {
            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res);
          } else if (w == 4) {
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res);
          } else {
            *((int *)(&dst[i * dst_stride + j])) = _mm_cvtsi128_si32(res);
          }
        }
      }
    }
  }
}